

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

Cord * __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::elements
          (RepeatedField<absl::lts_20250127::Cord> *this,bool is_soo)

{
  Cord *pCVar1;
  Nonnull<const_char_*> pcVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  pcVar2 = (Nonnull<const_char_*>)0x0;
  iVar3 = 0;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar3 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar3 < 1) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar3,0,"Capacity(is_soo) > 0");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (is_soo) {
      return (Cord *)((long)&(this->soo_rep_).field_0 + 8);
    }
    pCVar1 = (Cord *)internal::LongSooRep::elements((LongSooRep *)this);
    return pCVar1;
  }
  elements();
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }